

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O1

CheckedError __thiscall
flatbuffers::EnumValBuilder::AcceptEnumerator(EnumValBuilder *this,string *name)

{
  EnumDef *pEVar1;
  string *msg;
  bool bVar2;
  string *in_RDX;
  CheckedError *ce;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((name->field_2)._M_allocated_capacity == 0) {
    __assert_fail("temp",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x960,
                  "CheckedError flatbuffers::EnumValBuilder::AcceptEnumerator(const std::string &)")
    ;
  }
  ValidateValue(this,(int64_t *)name,(bool)((char)(name->field_2)._M_allocated_capacity + -0x60));
  *(undefined1 *)((long)&this->parser + 1) = 1;
  if (*(char *)&this->parser == '\0') {
    pEVar1 = (((EnumVal *)(name->field_2)._M_allocated_capacity)->union_type).enum_def;
    if (pEVar1 != (EnumDef *)name->_M_string_length && pEVar1 != (EnumDef *)0x0) {
      __assert_fail("(temp->union_type.enum_def == nullptr) || (temp->union_type.enum_def == &enum_def)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                    ,0x963,
                    "CheckedError flatbuffers::EnumValBuilder::AcceptEnumerator(const std::string &)"
                   );
    }
    bVar2 = SymbolTable<flatbuffers::EnumVal>::Add
                      (&((EnumDef *)name->_M_string_length)->vals,in_RDX,
                       (EnumVal *)(name->field_2)._M_allocated_capacity);
    (name->field_2)._M_allocated_capacity = 0;
    if (bVar2) {
      msg = (string *)(name->_M_dataplus)._M_p;
      std::operator+(&local_40,"enum value already exists: ",in_RDX);
      Parser::Error((Parser *)this,msg);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      *(undefined2 *)&this->parser = 0;
    }
  }
  return SUB82(this,0);
}

Assistant:

FLATBUFFERS_CHECKED_ERROR AcceptEnumerator(const std::string &name) {
    FLATBUFFERS_ASSERT(temp);
    ECHECK(ValidateValue(&temp->value, false == user_value));
    FLATBUFFERS_ASSERT((temp->union_type.enum_def == nullptr) ||
                       (temp->union_type.enum_def == &enum_def));
    auto not_unique = enum_def.vals.Add(name, temp);
    temp = nullptr;
    if (not_unique) return parser.Error("enum value already exists: " + name);
    return NoError();
  }